

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O0

int64_t msa_binsl_df(uint32_t df,int64_t dest,int64_t arg1,int64_t arg2)

{
  char cVar1;
  byte bVar2;
  int iVar3;
  byte bVar4;
  int32_t sh_a;
  int32_t sh_d;
  uint64_t u_dest;
  uint64_t u_arg1;
  int64_t arg2_local;
  int64_t arg1_local;
  int64_t dest_local;
  ulong uStack_10;
  uint32_t df_local;
  
  cVar1 = (char)df;
  uStack_10 = arg1 & 0xffffffffffffffffU >> (0x40U - (char)(1L << (cVar1 + 3U & 0x3f)) & 0x3f);
  iVar3 = (int)((ulong)arg2 % (ulong)(1L << (cVar1 + 3U & 0x3f))) + 1;
  bVar2 = (byte)iVar3;
  bVar4 = (char)(1L << (cVar1 + 3U & 0x3f)) - bVar2;
  if ((long)iVar3 != 1L << (cVar1 + 3U & 0x3f)) {
    uStack_10 = ((dest & 0xffffffffffffffffU >> (0x40U - (char)(1L << (cVar1 + 3U & 0x3f)) & 0x3f))
                 << (bVar2 & 0x3f) &
                0xffffffffffffffffU >> (0x40U - (char)(1L << (cVar1 + 3U & 0x3f)) & 0x3f)) >>
                (bVar2 & 0x3f) &
                0xffffffffffffffffU >> (0x40U - (char)(1L << (cVar1 + 3U & 0x3f)) & 0x3f) |
                (uStack_10 >> (bVar4 & 0x3f) &
                0xffffffffffffffffU >> (0x40U - (char)(1L << (cVar1 + 3U & 0x3f)) & 0x3f)) <<
                (bVar4 & 0x3f) &
                0xffffffffffffffffU >> (0x40U - (char)(1L << (cVar1 + 3U & 0x3f)) & 0x3f);
  }
  return uStack_10;
}

Assistant:

static inline int64_t msa_binsl_df(uint32_t df,
                                   int64_t dest, int64_t arg1, int64_t arg2)
{
    uint64_t u_arg1 = UNSIGNED(arg1, df);
    uint64_t u_dest = UNSIGNED(dest, df);
    int32_t sh_d = BIT_POSITION(arg2, df) + 1;
    int32_t sh_a = DF_BITS(df) - sh_d;
    if (sh_d == DF_BITS(df)) {
        return u_arg1;
    } else {
        return UNSIGNED(UNSIGNED(u_dest << sh_d, df) >> sh_d, df) |
               UNSIGNED(UNSIGNED(u_arg1 >> sh_a, df) << sh_a, df);
    }
}